

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(void)

{
  void *self;
  void *pvVar1;
  char timebuf [32];
  char acStack_38 [40];
  
  self = rmlLinkedListCreate();
  rmlLinkedListPush(self,"C");
  rmlLinkedListPush(self,"C++");
  rmlLinkedListPush(self,"Python");
  rmlLinkedListPush(self,"JavaScript");
  rmlLinkedListPush(self,"TypeScript");
  rmlLinkedListPush(self,"C#");
  rmlLinkedListPush(self,"Rust");
  rmlLinkedListPop(self);
  rmlLinkedListShift(self);
  rmlLinkedListRemove(self,1);
  rmlLinkedListEach(self,eachCallback,(void *)0x0);
  rml_get_current_local_time(acStack_38,0x20);
  printf("[%s] %s(%d) [%s] ",acStack_38,
         "/workspace/llm4binary/github/license_all_cmakelists_25/plter[P]rml/examples/test_linkedlist/main.c"
         ,0x1d,"INFO");
  pvVar1 = rmlLinkedListGet(self,2);
  printf("Value at index 2: %s",pvVar1);
  putchar(10);
  rmlLinkedListDestroy(self);
  return 0;
}

Assistant:

int main() {

    void *list = rmlLinkedListCreate();
    rmlLinkedListPush(list, "C");
    rmlLinkedListPush(list, "C++");
    rmlLinkedListPush(list, "Python");
    rmlLinkedListPush(list, "JavaScript");
    rmlLinkedListPush(list, "TypeScript");
    rmlLinkedListPush(list, "C#");
    rmlLinkedListPush(list, "Rust");
    rmlLinkedListPop(list);
    rmlLinkedListShift(list);
    rmlLinkedListRemove(list, 1);

    rmlLinkedListEach(list, &eachCallback, NULL);

    RML_INFO("Value at index 2: %s", (char *) rmlLinkedListGet(list, 2));

    rmlLinkedListDestroy(list);
    return 0;
}